

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

Vec_Int_t * Abc_NtkFinComputeObjects(Vec_Int_t *vPairs,Vec_Wec_t **pvMap,int nObjs)

{
  uint Entry;
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  Vec_Wec_t *pVVar3;
  Vec_Int_t *pVVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  size_t __nmemb;
  int iVar9;
  int iVar10;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar2 = (int *)malloc(400);
  p->pArray = piVar2;
  pVVar3 = (Vec_Wec_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < nObjs - 1U) {
    iVar6 = nObjs;
  }
  pVVar3->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar6,0x10);
  }
  pVVar3->pArray = pVVar4;
  pVVar3->nSize = nObjs;
  *pvMap = pVVar3;
  if (3 < vPairs->nSize) {
    uVar8 = 2;
    iVar6 = 3;
    do {
      Entry = vPairs->pArray[uVar8];
      Vec_IntPush(p,Entry);
      pVVar3 = *pvMap;
      iVar10 = pVVar3->nSize;
      if (iVar10 <= (int)Entry) {
        iVar9 = Entry + 1;
        iVar1 = iVar10 * 2;
        if (iVar10 * 2 <= iVar9) {
          iVar1 = iVar9;
        }
        iVar10 = pVVar3->nCap;
        if (iVar10 < iVar1) {
          if (pVVar3->pArray == (Vec_Int_t *)0x0) {
            pVVar4 = (Vec_Int_t *)malloc((long)iVar1 << 4);
          }
          else {
            pVVar4 = (Vec_Int_t *)realloc(pVVar3->pArray,(long)iVar1 << 4);
            iVar10 = pVVar3->nCap;
          }
          pVVar3->pArray = pVVar4;
          memset(pVVar4 + iVar10,0,(long)(iVar1 - iVar10) << 4);
          pVVar3->nCap = iVar1;
        }
        pVVar3->nSize = iVar9;
        iVar10 = iVar9;
      }
      if (((int)Entry < 0) || (iVar10 <= (int)Entry)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(pVVar3->pArray + Entry,(uint)(uVar8 >> 1) & 0x7fffffff);
      uVar8 = uVar8 + 2;
      iVar6 = iVar6 + 2;
    } while (iVar6 < vPairs->nSize);
    __nmemb = (size_t)p->nSize;
    if (1 < (long)__nmemb) {
      piVar2 = p->pArray;
      qsort(piVar2,__nmemb,4,Vec_IntSortCompare1);
      iVar6 = 1;
      sVar5 = 1;
      do {
        if (piVar2[sVar5] != piVar2[sVar5 - 1]) {
          lVar7 = (long)iVar6;
          iVar6 = iVar6 + 1;
          piVar2[lVar7] = piVar2[sVar5];
        }
        sVar5 = sVar5 + 1;
      } while (__nmemb != sVar5);
      p->nSize = iVar6;
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkFinComputeObjects( Vec_Int_t * vPairs, Vec_Wec_t ** pvMap, int nObjs )
{
    int i, iObj, Type;
    Vec_Int_t * vObjs = Vec_IntAlloc( 100 );
    *pvMap = Vec_WecStart( nObjs );
    Vec_IntForEachEntryDoubleStart( vPairs, iObj, Type, i, 2 )
    {
        Vec_IntPush( vObjs, iObj );
        Vec_WecPush( *pvMap, iObj, i/2 );
    }
    Vec_IntUniqify( vObjs );
    return vObjs;
}